

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::BuildUniqueBoneList
               (list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *asBones,
               const_iterator it,const_iterator end)

{
  aiMesh *paVar1;
  aiBone *paVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  value_type local_68;
  aiMesh **local_38;
  
  iVar4 = 0;
  local_38 = end._M_current;
  do {
    if (it._M_current == local_38) {
      return;
    }
    for (uVar5 = 0; paVar1 = *it._M_current, uVar5 < paVar1->mNumBones; uVar5 = uVar5 + 1) {
      paVar2 = paVar1->mBones[uVar5];
      uVar3 = SuperFastHash((paVar2->mName).data,(paVar2->mName).length,0);
      p_Var6 = (_List_node_base *)asBones;
      do {
        p_Var6 = (((_List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                  &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var6 == (_List_node_base *)asBones) {
          local_68.pSrcBones.
          super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.pSrcBones.
          super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.super_pair<unsigned_int,_aiString_*>.first = 0;
          local_68.super_pair<unsigned_int,_aiString_*>._4_4_ = 0;
          local_68.super_pair<unsigned_int,_aiString_*>.second = (aiString *)0x0;
          local_68.pSrcBones.
          super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::push_back
                    (asBones,&local_68);
          std::
          _Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
          ::~_Vector_base(&local_68.pSrcBones.
                           super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
                         );
          p_Var6 = (asBones->
                   super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>).
                   _M_impl._M_node.super__List_node_base._M_prev;
          *(uint32_t *)&p_Var6[1]._M_next = uVar3;
          p_Var6[1]._M_prev = (_List_node_base *)paVar2;
          break;
        }
      } while (*(uint32_t *)&p_Var6[1]._M_next != uVar3);
      local_68.super_pair<unsigned_int,_aiString_*>.second =
           (aiString *)CONCAT44(local_68.super_pair<unsigned_int,_aiString_*>.second._4_4_,iVar4);
      local_68.super_pair<unsigned_int,_aiString_*>._0_8_ = paVar2;
      std::vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>::
      emplace_back<std::pair<aiBone*,unsigned_int>>
                ((vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
                  *)(p_Var6 + 2),(pair<aiBone_*,_unsigned_int> *)&local_68);
    }
    iVar4 = iVar4 + paVar1->mNumVertices;
    it._M_current = it._M_current + 1;
  } while( true );
}

Assistant:

void SceneCombiner::BuildUniqueBoneList(std::list<BoneWithHash>& asBones,
    std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    unsigned int iOffset = 0;
    for (; it != end;++it)  {
        for (unsigned int l = 0; l < (*it)->mNumBones;++l)  {
            aiBone* p = (*it)->mBones[l];
            uint32_t itml = SuperFastHash(p->mName.data,(unsigned int)p->mName.length);

            std::list<BoneWithHash>::iterator it2  = asBones.begin();
            std::list<BoneWithHash>::iterator end2 = asBones.end();

            for (;it2 != end2;++it2)    {
                if ((*it2).first == itml)   {
                    (*it2).pSrcBones.push_back(BoneSrcIndex(p,iOffset));
                    break;
                }
            }
            if (end2 == it2)    {
                // need to begin a new bone entry
                asBones.push_back(BoneWithHash());
                BoneWithHash& btz = asBones.back();

                // setup members
                btz.first = itml;
                btz.second = &p->mName;
                btz.pSrcBones.push_back(BoneSrcIndex(p,iOffset));
            }
        }
        iOffset += (*it)->mNumVertices;
    }
}